

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::insert
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this,CSkinPart *item,
          range r)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  CSkinPart *pCVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int new_len;
  byte bVar9;
  
  bVar9 = 0;
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar7 = (int)((long)r.begin - (long)this->list >> 2) * -0x42108421;
    uVar1 = this->list_size;
    uVar8 = this->num_elements;
    if (uVar8 == uVar1) {
      uVar1 = 1;
      if (1 < (int)uVar8) {
        uVar1 = uVar8 >> 1;
      }
      alloc(this,uVar1 + uVar8);
      uVar1 = this->list_size;
      uVar8 = this->num_elements;
    }
    new_len = uVar8 + 1;
    if ((int)uVar1 <= (int)uVar8) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar7 < (int)uVar8) {
      lVar2 = (long)(int)uVar8;
      lVar6 = lVar2 * 0x7c;
      do {
        pCVar4 = this->list + (long)new_len + -2;
        pcVar5 = this->list->m_aName + lVar6 + -4;
        for (lVar3 = 0x1f; lVar3 != 0; lVar3 = lVar3 + -1) {
          *(int *)pcVar5 = pCVar4->m_Flags;
          pCVar4 = (CSkinPart *)((long)pCVar4 + ((ulong)bVar9 * -2 + 1) * 4);
          pcVar5 = pcVar5 + ((ulong)bVar9 * -2 + 1) * 4;
        }
        lVar2 = lVar2 + -1;
        new_len = new_len + -1;
        lVar6 = lVar6 + -0x7c;
      } while (iVar7 < lVar2);
    }
    pCVar4 = this->list + iVar7;
    for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
      pCVar4->m_Flags = item->m_Flags;
      item = (CSkinPart *)((long)item + (ulong)bVar9 * -8 + 4);
      pCVar4 = (CSkinPart *)((long)pCVar4 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    return this->num_elements + -1;
  }
  iVar7 = add(this,item);
  return iVar7;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}